

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,char_const*,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,char *significand,
          int significand_size,int exponent,digit_grouping<wchar_t> *grouping)

{
  wchar_t wVar1;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_00;
  char *s;
  size_t count;
  basic_string_view<char> local_2c0;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_2b0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_2a8;
  char local_299;
  appender local_298;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_290;
  appender local_288 [3];
  allocator<char> local_269;
  undefined1 local_268 [8];
  memory_buffer buffer;
  digit_grouping<wchar_t> *grouping_local;
  int exponent_local;
  int significand_size_local;
  char *significand_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  wVar1 = digit_grouping<wchar_t>::separator(grouping);
  if (wVar1 == L'\0') {
    out_00 = write_significand<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                       (out,significand,significand_size);
    buffer.alloc_ = (allocator<char>)0x30;
    buffer._533_3_ = 0;
    out_local = fill_n<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,wchar_t>
                          (out_00,exponent,(wchar_t *)&buffer.alloc_);
  }
  else {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268,&local_269);
    std::allocator<char>::~allocator(&local_269);
    appender::back_insert_iterator(local_288,(buffer<char> *)local_268);
    local_290.container =
         (buffer<char> *)
         write_significand<char,fmt::v8::appender>(local_288[0],significand,significand_size);
    appender::back_insert_iterator(&local_298,(buffer<char> *)local_268);
    local_299 = '0';
    local_2a8.container =
         (buffer<char> *)fill_n<fmt::v8::appender,int,char>(local_298,exponent,&local_299);
    local_2b0.container = out.container;
    s = buffer<char>::data((buffer<char> *)local_268);
    count = buffer<char>::size((buffer<char> *)local_268);
    basic_string_view<char>::basic_string_view(&local_2c0,s,count);
    out_local = digit_grouping<wchar_t>::
                apply<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,char>
                          (grouping,local_2b0,local_2c0);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_268);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int exponent,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    out = write_significand<Char>(out, significand, significand_size);
    return detail::fill_n(out, exponent, static_cast<Char>('0'));
  }
  auto buffer = memory_buffer();
  write_significand<char>(appender(buffer), significand, significand_size);
  detail::fill_n(appender(buffer), exponent, '0');
  return grouping.apply(out, string_view(buffer.data(), buffer.size()));
}